

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::compute_B_int8_scale(Mat *B,float *scale)

{
  undefined1 auVar1 [32];
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined1 (*pauVar5) [32];
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  
  bVar10 = B->dims == 3;
  iVar4 = B->w;
  if (bVar10) {
    iVar4 = (int)B->cstep;
  }
  iVar4 = iVar4 * B->elempack;
  iVar3 = B->w * B->elempack;
  uVar6 = 0;
  uVar2 = (&B->h)[(ulong)bVar10 * 2];
  if ((&B->h)[(ulong)bVar10 * 2] < 1) {
    uVar2 = uVar6;
  }
  auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  auVar16._16_4_ = 0x7fffffff;
  auVar16._20_4_ = 0x7fffffff;
  auVar16._24_4_ = 0x7fffffff;
  auVar16._28_4_ = 0x7fffffff;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
    pauVar5 = (undefined1 (*) [32])((long)B->data + (long)(iVar4 * (int)uVar7) * 4);
    lVar8 = 0;
    for (iVar9 = 0; iVar9 + 7 < iVar3; iVar9 = iVar9 + 8) {
      auVar1 = vandps_avx(auVar16,*pauVar5);
      auVar1 = vmaxps_avx(auVar15._0_32_,auVar1);
      auVar15 = ZEXT3264(auVar1);
      pauVar5 = pauVar5 + 1;
      lVar8 = lVar8 + 8;
    }
    for (; iVar9 + 3 < iVar3; iVar9 = iVar9 + 4) {
      auVar13 = vandps_avx(auVar17,*(undefined1 (*) [16])*pauVar5);
      auVar13 = vmaxps_avx(auVar14._0_16_,auVar13);
      auVar14 = ZEXT1664(auVar13);
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
      lVar8 = lVar8 + 4;
    }
    for (; (int)lVar8 < iVar3; lVar8 = lVar8 + 1) {
      auVar13 = vandps_avx(ZEXT416(*(uint *)((long)B->data + lVar8 * 4 + (long)(int)uVar6 * 4)),
                           auVar17);
      auVar13 = vmaxss_avx(auVar13,auVar11._0_16_);
      auVar11 = ZEXT1664(auVar13);
    }
    uVar6 = uVar6 + iVar4;
  }
  auVar17 = vmaxps_avx(auVar15._16_16_,auVar15._0_16_);
  auVar13 = vshufpd_avx(auVar17,auVar17,3);
  auVar17 = vmaxps_avx(auVar17,auVar13);
  auVar13 = vmovshdup_avx(auVar17);
  auVar13 = vmaxss_avx(auVar17,auVar13);
  auVar12 = auVar14._0_16_;
  auVar17 = vshufpd_avx(auVar12,auVar12,3);
  auVar17 = vmaxps_avx(auVar12,auVar17);
  auVar12 = vmovshdup_avx(auVar17);
  auVar17 = vmaxss_avx(auVar17,auVar12);
  auVar17 = vmaxss_avx(auVar17,auVar11._0_16_);
  auVar17 = vmaxss_avx(auVar17,auVar13);
  auVar13._0_4_ = 127.0 / auVar17._0_4_;
  auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar17 = vcmpss_avx(auVar17,ZEXT816(0) << 0x20,0);
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar17 = vblendvps_avx(auVar13,auVar12,auVar17);
  *scale = auVar17._0_4_;
  return;
}

Assistant:

static void compute_B_int8_scale(const Mat& B, float& scale)
{
    compute_B_fp32_int8_scale(B, scale);
}